

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

void curl_easy_cleanup(Curl_easy *data)

{
  Curl_easy *in_RDI;
  sigpipe_ignore pipe_st;
  Curl_easy *local_b0;
  sigpipe_ignore local_a8;
  
  if (in_RDI != (Curl_easy *)0x0) {
    sigpipe_ignore(in_RDI,&local_a8);
    Curl_close(&local_b0);
    if (local_a8.no_signal == false) {
      sigaction(0xd,(sigaction *)&local_a8,(sigaction *)0x0);
    }
  }
  return;
}

Assistant:

void curl_easy_cleanup(struct Curl_easy *data)
{
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return;

  sigpipe_ignore(data, &pipe_st);
  Curl_close(&data);
  sigpipe_restore(&pipe_st);
}